

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_means_template.h
# Opt level: O0

void calc_centroids_dim1(int16_t *data,int16_t *centroids,uint8_t *indices,int n,int k)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  uint32_t uVar4;
  long lVar5;
  uint in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int index;
  uint rand_state;
  int centroids_sum [8];
  int count [8];
  int j;
  int i;
  int local_68 [8];
  int local_48 [8];
  int local_28;
  int local_24;
  int local_20;
  uint local_1c;
  long local_18;
  long local_10;
  long local_8;
  
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(local_48,0,0x20);
  memset(local_68,0,(long)local_20 << 2);
  for (local_24 = 0; local_24 < (int)local_1c; local_24 = local_24 + 1) {
    uVar3 = (uint)*(byte *)(local_18 + local_24);
    local_48[(int)uVar3] = local_48[(int)uVar3] + 1;
    for (local_28 = 0; local_28 < 1; local_28 = local_28 + 1) {
      local_68[(int)(uVar3 + local_28)] =
           (int)*(short *)(local_8 + (long)(local_24 + local_28) * 2) +
           local_68[(int)(uVar3 + local_28)];
    }
  }
  for (local_24 = 0; lVar2 = local_8, lVar1 = local_10, local_24 < local_20; local_24 = local_24 + 1
      ) {
    if (local_48[local_24] == 0) {
      lVar5 = (long)local_24;
      uVar4 = lcg_rand16((uint32_t *)0x27ea4c);
      *(undefined2 *)(lVar1 + lVar5 * 2) =
           *(undefined2 *)(lVar2 + ((ulong)uVar4 % (ulong)local_1c) * 2);
    }
    else {
      for (local_28 = 0; local_28 < 1; local_28 = local_28 + 1) {
        *(short *)(local_10 + (long)(local_24 + local_28) * 2) =
             (short)((local_68[local_24 + local_28] + (local_48[local_24] >> 1)) /
                    local_48[local_24]);
      }
    }
  }
  return;
}

Assistant:

static void RENAME(calc_centroids)(const int16_t *data, int16_t *centroids,
                                   const uint8_t *indices, int n, int k) {
  int i, j;
  int count[PALETTE_MAX_SIZE] = { 0 };
  int centroids_sum[AV1_K_MEANS_DIM * PALETTE_MAX_SIZE];
  unsigned int rand_state = (unsigned int)data[0];
  assert(n <= 32768);
  memset(centroids_sum, 0, sizeof(centroids_sum[0]) * k * AV1_K_MEANS_DIM);

  for (i = 0; i < n; ++i) {
    const int index = indices[i];
    assert(index < k);
    ++count[index];
    for (j = 0; j < AV1_K_MEANS_DIM; ++j) {
      centroids_sum[index * AV1_K_MEANS_DIM + j] +=
          data[i * AV1_K_MEANS_DIM + j];
    }
  }

  for (i = 0; i < k; ++i) {
    if (count[i] == 0) {
      memcpy(centroids + i * AV1_K_MEANS_DIM,
             data + (lcg_rand16(&rand_state) % n) * AV1_K_MEANS_DIM,
             sizeof(centroids[0]) * AV1_K_MEANS_DIM);
    } else {
      for (j = 0; j < AV1_K_MEANS_DIM; ++j) {
        centroids[i * AV1_K_MEANS_DIM + j] =
            DIVIDE_AND_ROUND(centroids_sum[i * AV1_K_MEANS_DIM + j], count[i]);
      }
    }
  }
}